

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InnerProduct.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeInnnerProduct(ConvertLayerParameters layerParameters)

{
  int *this;
  RepeatedField<float> *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  Rep *pRVar4;
  pointer pcVar5;
  string *psVar6;
  pointer pcVar7;
  ActivationReLU *pAVar8;
  void *pvVar9;
  bool bVar10;
  char cVar11;
  int iVar12;
  Type *pTVar13;
  Type *pTVar14;
  undefined8 *puVar15;
  long *plVar16;
  Type *pTVar17;
  FlattenLayerParams *this_01;
  InnerProductLayerParams *this_02;
  LogMessage *pLVar18;
  WeightParams *pWVar19;
  uint uVar20;
  uint uVar21;
  size_type *psVar22;
  ulong *puVar23;
  long *plVar24;
  char **ppcVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  char cVar32;
  char *pcVar33;
  undefined8 uVar34;
  long lVar35;
  uint64 uVar36;
  uint uVar37;
  void **ppvVar38;
  InnerProductParameter *pIVar39;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  uint *in_stack_00000048;
  string __str_4;
  string __str_3;
  string __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string __str_8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top_flatten;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string __str_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  undefined1 local_360 [56];
  ulong local_328;
  undefined1 local_320 [56];
  Type *local_2e8;
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0;
  undefined8 uStack_2c8;
  LayerUnion local_2c0;
  char **local_2b8;
  long local_2b0;
  char *local_2a8;
  long lStack_2a0;
  ulong *local_298;
  long local_290;
  ulong local_288;
  long lStack_280;
  string local_278;
  ulong local_258;
  undefined1 local_250 [56];
  string local_218;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1d8;
  undefined1 local_1c0 [16];
  char *local_1b0 [5];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  uint64 local_170;
  string local_168;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar29 = *in_stack_00000048;
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),uVar29);
  iVar12 = getLayerIndex(pTVar13,in_stack_00000030);
  pTVar14 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar12);
  if (((pTVar13->bottom_).super_RepeatedPtrFieldBase.current_size_ != 1) ||
     ((pTVar13->top_).super_RepeatedPtrFieldBase.current_size_ != 1)) {
    local_360._0_8_ = local_360 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"Must have 1 input and 1 output","");
    errorInCaffeProto((string *)local_360,(pTVar13->name_).ptr_,(pTVar13->type_).ptr_);
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
  }
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pRVar4 = (pTVar13->bottom_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar35 = (long)(pTVar13->bottom_).super_RepeatedPtrFieldBase.current_size_;
  local_2e8 = pTVar13;
  if (lVar35 != 0) {
    lVar31 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_1d8,*(value_type **)((long)ppvVar38 + lVar31));
      lVar31 = lVar31 + 8;
    } while (lVar35 * 8 != lVar31);
  }
  pRVar4 = (local_2e8->top_).super_RepeatedPtrFieldBase.rep_;
  ppvVar38 = pRVar4->elements;
  if (pRVar4 == (Rep *)0x0) {
    ppvVar38 = (void **)0x0;
  }
  lVar35 = (long)(local_2e8->top_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar35 != 0) {
    lVar31 = 0;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_188,*(value_type **)((long)ppvVar38 + lVar31));
      lVar31 = lVar31 + 8;
    } while (lVar35 * 8 != lVar31);
  }
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar7 = local_250 + 0x10;
  pcVar5 = ((local_1d8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_250._0_8_ = pcVar7;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_250,pcVar5,
             pcVar5 + (local_1d8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  std::__cxx11::string::append(local_250);
  uVar30 = -uVar29;
  if (0 < (int)uVar29) {
    uVar30 = uVar29;
  }
  uVar28 = 1;
  if (9 < uVar30) {
    uVar26 = (ulong)uVar30;
    uVar37 = 4;
    do {
      uVar28 = uVar37;
      uVar20 = (uint)uVar26;
      if (uVar20 < 100) {
        uVar28 = uVar28 - 2;
        goto LAB_003e6a33;
      }
      if (uVar20 < 1000) {
        uVar28 = uVar28 - 1;
        goto LAB_003e6a33;
      }
      if (uVar20 < 10000) goto LAB_003e6a33;
      uVar26 = uVar26 / 10000;
      uVar37 = uVar28 + 4;
    } while (99999 < uVar20);
    uVar28 = uVar28 + 1;
  }
LAB_003e6a33:
  local_1c0._0_8_ = local_1b0;
  std::__cxx11::string::_M_construct((ulong)local_1c0,(char)uVar28 - (char)((int)uVar29 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar29 >> 0x1f) + local_1c0._0_8_),uVar28,uVar30);
  pcVar33 = (char *)0xf;
  if ((pointer)local_250._0_8_ != pcVar7) {
    pcVar33 = (char *)local_250._16_8_;
  }
  if (pcVar33 < (char *)(local_1c0._8_8_ + local_250._8_8_)) {
    pcVar33 = (char *)0xf;
    if ((char **)local_1c0._0_8_ != local_1b0) {
      pcVar33 = local_1b0[0];
    }
    if (pcVar33 < (char *)(local_1c0._8_8_ + local_250._8_8_)) goto LAB_003e6abc;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_1c0,0,(char *)0x0,local_250._0_8_);
  }
  else {
LAB_003e6abc:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_250,local_1c0._0_8_);
  }
  local_320._0_8_ = local_320 + 0x10;
  psVar22 = puVar15 + 2;
  if ((size_type *)*puVar15 == psVar22) {
    local_320._16_8_ = *psVar22;
    local_320._24_8_ = puVar15[3];
  }
  else {
    local_320._16_8_ = *psVar22;
    local_320._0_8_ = (size_type *)*puVar15;
  }
  local_320._8_8_ = puVar15[1];
  *puVar15 = psVar22;
  puVar15[1] = 0;
  *(undefined1 *)psVar22 = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_320);
  local_360._0_8_ = local_360 + 0x10;
  psVar22 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar22) {
    local_360._16_8_ = *psVar22;
    local_360._24_8_ = plVar16[3];
  }
  else {
    local_360._16_8_ = *psVar22;
    local_360._0_8_ = (size_type *)*plVar16;
  }
  local_360._8_8_ = plVar16[1];
  *plVar16 = (long)psVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  if ((char **)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0] + 1));
  }
  if ((pointer)local_250._0_8_ != pcVar7) {
    operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
  }
  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  psVar6 = (local_2e8->name_).ptr_;
  local_360._0_8_ = local_360 + 0x10;
  pcVar7 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_360,pcVar7,pcVar7 + psVar6->_M_string_length);
  std::__cxx11::string::append(local_360);
  convertCaffeMetadata
            ((string *)local_360,&local_1d8,&local_1f8,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
    operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
  }
  if (pTVar17->_oneof_case_[0] != 0x12d) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar17);
    pTVar17->_oneof_case_[0] = 0x12d;
    this_01 = (FlattenLayerParams *)operator_new(0x18);
    CoreML::Specification::FlattenLayerParams::FlattenLayerParams(this_01);
    (pTVar17->layer_).flatten_ = this_01;
  }
  (((pTVar17->layer_).convolution_)->kernelsize_).current_size_ = 0;
  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  pTVar13 = local_2e8;
  convertCaffeMetadata
            ((local_2e8->name_).ptr_,&local_1f8,&local_188,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)in_stack_00000018,
             in_stack_00000028);
  pcVar7 = local_360 + 0x10;
  plVar16 = (long *)(local_320 + 0x10);
  if (pTVar17->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar17);
    pTVar17->_oneof_case_[0] = 0x8c;
    this_02 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_02);
    (pTVar17->layer_).innerproduct_ = this_02;
  }
  pIVar39 = pTVar13->inner_product_param_;
  if (pIVar39 == (InnerProductParameter *)0x0) {
    pIVar39 = (InnerProductParameter *)&caffe::_InnerProductParameter_default_instance_;
  }
  local_2c0 = pTVar17->layer_;
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_360._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"Weight blobs not provided","");
    psVar6 = (pTVar13->name_).ptr_;
    local_320._0_8_ = plVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Innerproduct","");
    errorInCaffeProto((string *)local_360,psVar6,(string *)local_320);
    if ((long *)local_320._0_8_ != plVar16) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_360._0_8_ != pcVar7) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
  }
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar18 = google::protobuf::internal::LogMessage::operator<<
                        (&local_d8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
  }
  puVar15 = *(undefined8 **)
             ((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar15 == (undefined8 *)0x0) {
    puVar15 = &caffe::_BlobShape_default_instance_;
  }
  iVar12 = (pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_;
  if (*(int *)(puVar15 + 3) == 0) {
    if (iVar12 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_148);
    }
    local_328 = (ulong)*(int *)((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements
                                      [0] + 0x88);
    if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    uVar36 = (uint64)*(int *)((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                             + 0x8c);
  }
  else {
    if (iVar12 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    puVar15 = *(undefined8 **)
               ((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar15 + 3) < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    local_328 = *(ulong *)(puVar15[4] + 8);
    if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_148,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_148,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_148);
    }
    puVar15 = *(undefined8 **)
               ((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
    if (puVar15 == (undefined8 *)0x0) {
      puVar15 = &caffe::_BlobShape_default_instance_;
    }
    if (*(int *)(puVar15 + 3) < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    uVar36 = *(uint64 *)(puVar15[4] + 0x10);
  }
  uVar29 = pIVar39->num_output_;
  uVar26 = (ulong)uVar29;
  bVar2 = pIVar39->bias_term_;
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    local_258 = 0;
  }
  else {
    if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_1c0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5ca);
      pLVar18 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_1c0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1c0);
    }
    local_258 = (ulong)*(int *)(*(long *)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) +
                               0x18);
  }
  if (pIVar39->transpose_ == true) {
    local_360._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"transpose","");
    psVar6 = (local_2e8->name_).ptr_;
    local_320._0_8_ = plVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Inner Product","");
    unsupportedCaffeParrameter((string *)local_360,psVar6,(string *)local_320);
    if ((long *)local_320._0_8_ != plVar16) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((pointer)local_360._0_8_ != pcVar7) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
  }
  if (pIVar39->axis_ != 1) {
    local_360._0_8_ = pcVar7;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_360,"axis","");
    psVar6 = (local_2e8->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Inner Product","");
    uVar30 = pIVar39->axis_;
    uVar28 = -uVar30;
    if (0 < (int)uVar30) {
      uVar28 = uVar30;
    }
    uVar37 = 1;
    if (9 < uVar28) {
      uVar27 = (ulong)uVar28;
      uVar20 = 4;
      do {
        uVar37 = uVar20;
        uVar21 = (uint)uVar27;
        if (uVar21 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003e72fd;
        }
        if (uVar21 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003e72fd;
        }
        if (uVar21 < 10000) goto LAB_003e72fd;
        uVar27 = uVar27 / 10000;
        uVar20 = uVar37 + 4;
      } while (99999 < uVar21);
      uVar37 = uVar37 + 1;
    }
LAB_003e72fd:
    local_250._0_8_ = local_250 + 0x10;
    local_170 = uVar36;
    std::__cxx11::string::_M_construct((ulong)local_250,(char)uVar37 - (char)((int)uVar30 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(local_250._0_8_ + (ulong)(uVar30 >> 0x1f)),uVar37,uVar28);
    unsupportedCaffeParrameterWithOption
              ((string *)local_360,psVar6,(string *)local_320,(string *)local_250);
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
    }
    uVar36 = local_170;
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
  }
  bVar10 = (long)local_258 < 1;
  if (bVar2 != false) {
    bVar10 = local_258 != 0;
  }
  if (!bVar10) {
    local_360._0_8_ = local_360 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_360,"\'bias_term\' flag and blob size for bias incompatible","");
    psVar6 = (local_2e8->name_).ptr_;
    local_320._0_8_ = local_320 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_320,"Inner Product","");
    errorInCaffeProto((string *)local_360,psVar6,(string *)local_320);
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
  }
  if ((long)local_328 < 0) {
    __assert_fail("outputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x5f,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  uVar27 = local_328;
  if (local_328 != uVar26) {
    cVar32 = '\x01';
    if (9 < uVar29) {
      uVar27 = uVar26;
      cVar11 = '\x04';
      do {
        cVar32 = cVar11;
        if (uVar27 < 100) {
          cVar32 = cVar32 + -2;
          goto LAB_003e74db;
        }
        if (uVar27 < 1000) {
          cVar32 = cVar32 + -1;
          goto LAB_003e74db;
        }
        if (uVar27 < 10000) goto LAB_003e74db;
        bVar10 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar11 = cVar32 + '\x04';
      } while (bVar10);
      cVar32 = cVar32 + '\x01';
    }
LAB_003e74db:
    local_298 = &local_288;
    std::__cxx11::string::_M_construct((ulong)&local_298,cVar32);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_298,(uint)local_290,uVar26);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x5feff8);
    puVar23 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar23) {
      local_2d0 = *puVar23;
      uStack_2c8 = puVar15[3];
      local_2e0 = &local_2d0;
    }
    else {
      local_2d0 = *puVar23;
      local_2e0 = (ulong *)*puVar15;
    }
    local_2d8 = puVar15[1];
    *puVar15 = puVar23;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_250._0_8_ = local_250 + 0x10;
    plVar24 = plVar16 + 2;
    if ((long *)*plVar16 == plVar24) {
      local_250._16_8_ = *plVar24;
      local_250._24_8_ = plVar16[3];
    }
    else {
      local_250._16_8_ = *plVar24;
      local_250._0_8_ = (long *)*plVar16;
    }
    local_250._8_8_ = plVar16[1];
    *plVar16 = (long)plVar24;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    uVar29 = 1;
    if (9 < local_328) {
      uVar26 = local_328;
      uVar30 = 4;
      do {
        uVar29 = uVar30;
        if (uVar26 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_003e763c;
        }
        if (uVar26 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_003e763c;
        }
        if (uVar26 < 10000) goto LAB_003e763c;
        bVar10 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        uVar30 = uVar29 + 4;
      } while (bVar10);
      uVar29 = uVar29 + 1;
    }
LAB_003e763c:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,(char)uVar29);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,uVar29,local_328);
    pcVar33 = (char *)0xf;
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      pcVar33 = (char *)local_250._16_8_;
    }
    if (pcVar33 < (char *)(local_250._8_8_ + local_2b0)) {
      pcVar33 = (char *)0xf;
      if (local_2b8 != &local_2a8) {
        pcVar33 = local_2a8;
      }
      if (pcVar33 < (char *)(local_250._8_8_ + local_2b0)) goto LAB_003e76c8;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,local_250._0_8_);
    }
    else {
LAB_003e76c8:
      puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_250,(ulong)local_2b8);
    }
    local_320._0_8_ = local_320 + 0x10;
    psVar22 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar22) {
      local_320._16_8_ = *psVar22;
      local_320._24_8_ = puVar15[3];
    }
    else {
      local_320._16_8_ = *psVar22;
      local_320._0_8_ = (size_type *)*puVar15;
    }
    local_320._8_8_ = puVar15[1];
    *puVar15 = psVar22;
    puVar15[1] = 0;
    *(undefined1 *)psVar22 = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_320);
    local_360._0_8_ = local_360 + 0x10;
    psVar22 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar22) {
      local_360._16_8_ = *psVar22;
      local_360._24_8_ = plVar16[3];
    }
    else {
      local_360._16_8_ = *psVar22;
      local_360._0_8_ = (size_type *)*plVar16;
    }
    local_360._8_8_ = plVar16[1];
    *plVar16 = (long)psVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    psVar6 = (local_2e8->name_).ptr_;
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"Inner Product","");
    errorInCaffeProto((string *)local_360,psVar6,&local_278);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,(ulong)(local_2a8 + 1));
    }
    if ((undefined1 *)local_250._0_8_ != local_250 + 0x10) {
      operator_delete((void *)local_250._0_8_,(ulong)(local_250._16_8_ + 1));
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    uVar27 = local_328;
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
  }
  if ((long)uVar36 < 0) {
    __assert_fail("inputChannels >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x66,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  (local_2c0.innerproduct_)->inputchannels_ = uVar36;
  (local_2c0.splitnd_)->axis_ = uVar27;
  (local_2c0.innerproduct_)->hasbias_ = bVar2;
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_250,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar18 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_250,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_250);
  }
  uVar27 = uVar36 * uVar27;
  uVar29 = *(uint *)((long)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  if (uVar27 - (long)(int)uVar29 != 0) {
    uVar30 = 1;
    if (9 < uVar27) {
      uVar26 = uVar27;
      uVar28 = 4;
      do {
        uVar30 = uVar28;
        if (uVar26 < 100) {
          uVar30 = uVar30 - 2;
          goto LAB_003e79a5;
        }
        if (uVar26 < 1000) {
          uVar30 = uVar30 - 1;
          goto LAB_003e79a5;
        }
        if (uVar26 < 10000) goto LAB_003e79a5;
        bVar10 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        uVar28 = uVar30 + 4;
      } while (bVar10);
      uVar30 = uVar30 + 1;
    }
LAB_003e79a5:
    local_2b8 = &local_2a8;
    std::__cxx11::string::_M_construct((ulong)&local_2b8,(char)uVar30);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_2b8,uVar30,uVar27);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,0x5fe537);
    local_298 = &local_288;
    puVar23 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar23) {
      local_288 = *puVar23;
      lStack_280 = plVar16[3];
    }
    else {
      local_288 = *puVar23;
      local_298 = (ulong *)*plVar16;
    }
    local_290 = plVar16[1];
    *plVar16 = (long)puVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
    local_2e0 = &local_2d0;
    puVar23 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar23) {
      local_2d0 = *puVar23;
      uStack_2c8 = puVar15[3];
    }
    else {
      local_2d0 = *puVar23;
      local_2e0 = (ulong *)*puVar15;
    }
    local_2d8 = puVar15[1];
    *puVar15 = puVar23;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    uVar30 = -uVar29;
    if (0 < (int)uVar29) {
      uVar30 = uVar29;
    }
    uVar28 = 1;
    if (9 < uVar30) {
      uVar26 = (ulong)uVar30;
      uVar37 = 4;
      do {
        uVar28 = uVar37;
        uVar20 = (uint)uVar26;
        if (uVar20 < 100) {
          uVar28 = uVar28 - 2;
          goto LAB_003e7b05;
        }
        if (uVar20 < 1000) {
          uVar28 = uVar28 - 1;
          goto LAB_003e7b05;
        }
        if (uVar20 < 10000) goto LAB_003e7b05;
        uVar26 = uVar26 / 10000;
        uVar37 = uVar28 + 4;
      } while (99999 < uVar20);
      uVar28 = uVar28 + 1;
    }
LAB_003e7b05:
    paVar1 = &local_278.field_2;
    local_278._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_278,(char)uVar28 - (char)((int)uVar29 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_278._M_dataplus._M_p + (uVar29 >> 0x1f),uVar28,uVar30);
    uVar26 = 0xf;
    if (local_2e0 != &local_2d0) {
      uVar26 = local_2d0;
    }
    if (uVar26 < local_278._M_string_length + local_2d8) {
      uVar34 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != paVar1) {
        uVar34 = local_278.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar34 < local_278._M_string_length + local_2d8) goto LAB_003e7b9f;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2e0);
    }
    else {
LAB_003e7b9f:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_2e0,(ulong)local_278._M_dataplus._M_p);
    }
    psVar22 = puVar15 + 2;
    if ((size_type *)*puVar15 == psVar22) {
      local_320._16_8_ = *psVar22;
      local_320._24_8_ = puVar15[3];
      local_320._0_8_ = local_320 + 0x10;
    }
    else {
      local_320._16_8_ = *psVar22;
      local_320._0_8_ = (size_type *)*puVar15;
    }
    local_320._8_8_ = puVar15[1];
    *puVar15 = psVar22;
    puVar15[1] = 0;
    *(undefined1 *)psVar22 = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_320);
    local_360._0_8_ = local_360 + 0x10;
    psVar22 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar22) {
      local_360._16_8_ = *psVar22;
      local_360._24_8_ = plVar16[3];
    }
    else {
      local_360._16_8_ = *psVar22;
      local_360._0_8_ = (size_type *)*plVar16;
    }
    local_360._8_8_ = plVar16[1];
    *plVar16 = (long)psVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    psVar6 = (local_2e8->name_).ptr_;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"Inner Product","");
    errorInCaffeProto((string *)local_360,psVar6,&local_218);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if ((undefined1 *)local_320._0_8_ != local_320 + 0x10) {
      operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != paVar1) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,(ulong)(local_2a8 + 1));
    }
  }
  if (((local_2c0.activation_)->NonlinearityType_).linear_ == (ActivationLinear *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    ((local_2c0.activation_)->NonlinearityType_).linear_ = (ActivationLinear *)pWVar19;
  }
  if (0x7fffffff < (long)uVar27) {
    __assert_fail("blobSize <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x75,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pAVar8 = ((local_2c0.activation_)->NonlinearityType_).relu_;
  this = &pAVar8->_cached_size_;
  iVar12 = (int)uVar27;
  if (*this < iVar12) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)this,iVar12);
    iVar3 = *this;
    if (iVar3 != iVar12) {
      memset((void *)((long)pAVar8[1].super_MessageLite._vptr_MessageLite + (long)iVar3 * 4 + 8),0,
             (long)iVar12 * 4 + (long)iVar3 * -4);
    }
  }
  *this = iVar12;
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_320,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar18 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_320,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_360,pLVar18);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_320);
  }
  pvVar9 = ((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if ((int *)((long)pvVar9 + 0x18) != this) {
    *this = 0;
    iVar12 = *(int *)((long)pvVar9 + 0x18);
    if (iVar12 != 0) {
      google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)this,iVar12);
      memcpy((void *)((long)pAVar8[1].super_MessageLite._vptr_MessageLite +
                     (long)pAVar8->_cached_size_ * 4 + 8),
             (void *)(*(long *)((long)pvVar9 + 0x20) + 8),(long)*(int *)((long)pvVar9 + 0x18) << 2);
      pAVar8->_cached_size_ = pAVar8->_cached_size_ + *(int *)((long)pvVar9 + 0x18);
    }
  }
  if (bVar2 == false) goto LAB_003e847c;
  if (local_258 != local_328) {
    uVar29 = 1;
    if (9 < local_328) {
      uVar26 = local_328;
      uVar30 = 4;
      do {
        uVar29 = uVar30;
        if (uVar26 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_003e7f38;
        }
        if (uVar26 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_003e7f38;
        }
        if (uVar26 < 10000) goto LAB_003e7f38;
        bVar2 = 99999 < uVar26;
        uVar26 = uVar26 / 10000;
        uVar30 = uVar29 + 4;
      } while (bVar2);
      uVar29 = uVar29 + 1;
    }
LAB_003e7f38:
    local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_278,(char)uVar29);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_278._M_dataplus._M_p,uVar29,local_328);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,0x5fe537);
    local_2b8 = &local_2a8;
    ppcVar25 = (char **)(plVar16 + 2);
    if ((char **)*plVar16 == ppcVar25) {
      local_2a8 = *ppcVar25;
      lStack_2a0 = plVar16[3];
    }
    else {
      local_2a8 = *ppcVar25;
      local_2b8 = (char **)*plVar16;
    }
    local_2b0 = plVar16[1];
    *plVar16 = (long)ppcVar25;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    puVar23 = (ulong *)(plVar16 + 2);
    if ((ulong *)*plVar16 == puVar23) {
      local_288 = *puVar23;
      lStack_280 = plVar16[3];
      local_298 = &local_288;
    }
    else {
      local_288 = *puVar23;
      local_298 = (ulong *)*plVar16;
    }
    local_290 = plVar16[1];
    *plVar16 = (long)puVar23;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    uVar26 = -local_258;
    if (0 < (long)local_258) {
      uVar26 = local_258;
    }
    uVar29 = 1;
    if (9 < uVar26) {
      uVar27 = uVar26;
      uVar30 = 4;
      do {
        uVar29 = uVar30;
        if (uVar27 < 100) {
          uVar29 = uVar29 - 2;
          goto LAB_003e80ad;
        }
        if (uVar27 < 1000) {
          uVar29 = uVar29 - 1;
          goto LAB_003e80ad;
        }
        if (uVar27 < 10000) goto LAB_003e80ad;
        bVar2 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        uVar30 = uVar29 + 4;
      } while (bVar2);
      uVar29 = uVar29 + 1;
    }
LAB_003e80ad:
    lVar35 = (long)local_258 >> 0x3f;
    paVar1 = &local_218.field_2;
    local_218._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct
              ((ulong)&local_218,(char)uVar29 - (char)((long)local_258 >> 0x3f));
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_218._M_dataplus._M_p + -lVar35,uVar29,uVar26);
    uVar26 = 0xf;
    if (local_298 != &local_288) {
      uVar26 = local_288;
    }
    if (uVar26 < local_218._M_string_length + local_290) {
      uVar34 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != paVar1) {
        uVar34 = local_218.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar34 < local_218._M_string_length + local_290) goto LAB_003e8141;
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_298);
    }
    else {
LAB_003e8141:
      puVar15 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_298,(ulong)local_218._M_dataplus._M_p);
    }
    local_2e0 = &local_2d0;
    puVar23 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar23) {
      local_2d0 = *puVar23;
      uStack_2c8 = puVar15[3];
    }
    else {
      local_2d0 = *puVar23;
      local_2e0 = (ulong *)*puVar15;
    }
    local_2d8 = puVar15[1];
    *puVar15 = puVar23;
    puVar15[1] = 0;
    *(undefined1 *)puVar23 = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_360._0_8_ = local_360 + 0x10;
    psVar22 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar22) {
      local_360._16_8_ = *psVar22;
      local_360._24_8_ = plVar16[3];
    }
    else {
      local_360._16_8_ = *psVar22;
      local_360._0_8_ = (size_type *)*plVar16;
    }
    local_360._8_8_ = plVar16[1];
    *plVar16 = (long)psVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    psVar6 = (local_2e8->name_).ptr_;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"Inner Product","");
    errorInCaffeProto((string *)local_360,psVar6,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_360._0_8_ != local_360 + 0x10) {
      operator_delete((void *)local_360._0_8_,local_360._16_8_ + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != paVar1) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_298 != &local_288) {
      operator_delete(local_298,local_288 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,(ulong)(local_2a8 + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_dataplus._M_p != &local_278.field_2) {
      operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
    }
  }
  if ((local_2c0.innerproduct_)->bias_ == (WeightParams *)0x0) {
    pWVar19 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar19);
    (local_2c0.innerproduct_)->bias_ = pWVar19;
  }
  if (0x7fffffff < (long)local_328) {
    __assert_fail("outputChannels <= INT_MAX",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/InnerProduct.cpp"
                  ,0x81,
                  "void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters)"
                 );
  }
  pWVar19 = (local_2c0.innerproduct_)->bias_;
  this_00 = &pWVar19->floatvalue_;
  iVar12 = (int)local_328;
  if (this_00->current_size_ < iVar12) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,iVar12);
    iVar3 = this_00->current_size_;
    if (iVar3 != iVar12) {
      memset(((pWVar19->floatvalue_).rep_)->elements + iVar3,0,(long)iVar12 * 4 + (long)iVar3 * -4);
    }
  }
  this_00->current_size_ = iVar12;
  if ((pTVar14->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_360,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar18 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_360,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2e0,pLVar18);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_360);
  }
  lVar35 = *(long *)((pTVar14->blobs_).super_RepeatedPtrFieldBase.rep_ + 1);
  if ((RepeatedField<float> *)(lVar35 + 0x18) != this_00) {
    this_00->current_size_ = 0;
    iVar12 = *(int *)(lVar35 + 0x18);
    if (iVar12 != 0) {
      google::protobuf::RepeatedField<float>::Reserve(this_00,iVar12);
      memcpy(((pWVar19->floatvalue_).rep_)->elements + (pWVar19->floatvalue_).current_size_,
             (void *)(*(long *)(lVar35 + 0x20) + 8),(long)*(int *)(lVar35 + 0x18) << 2);
      (pWVar19->floatvalue_).current_size_ =
           (pWVar19->floatvalue_).current_size_ + *(int *)(lVar35 + 0x18);
    }
  }
LAB_003e847c:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1d8);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeInnnerProduct(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;
    
    //Write Layer metadata
    if (caffeLayer.bottom_size() != 1 || caffeLayer.top_size() != 1) {
        CoreMLConverter::errorInCaffeProto("Must have 1 input and 1 output",caffeLayer.name(),caffeLayer.type());
    }
    std::vector<std::string> bottom;
    std::vector<std::string> top;
    for (const auto& bottomName: caffeLayer.bottom()){
        bottom.push_back(bottomName);
    }
    for (const auto& topName: caffeLayer.top()){
        top.push_back(topName);
    }
    
    //We add two layers for the inner product layer: flatten + innerproduct
    std::vector<std::string> top_flatten;
    top_flatten.push_back(bottom[0] + "_" + std::to_string(layerId) + "_flattened");
    auto* nnWrite = layerParameters.nnWrite;
    
    //first write flatten
    Specification::NeuralNetworkLayer* specLayer_flatten = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name() + "_preflatten",
                                         bottom, top_flatten, nnWrite, mappingDataBlobNames);
    
    Specification::FlattenLayerParams* flatten_params = specLayer_flatten->mutable_flatten();
    flatten_params->set_mode(Specification::FlattenLayerParams::CHANNEL_FIRST);
    
    //now write inner product
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         top_flatten, top, nnWrite, mappingDataBlobNames);
    
    Specification::InnerProductLayerParams* specLayerParams = specLayer->mutable_innerproduct();
    const caffe::InnerProductParameter& caffeLayerParams = caffeLayer.inner_product_param();
    int64_t inputChannels = 0;
    int64_t outputChannels = 0;
    
    // First check that weights exist.
    if (caffeLayerWeights.blobs_size() == 0){
        CoreMLConverter::errorInCaffeProto(
            "Weight blobs not provided", caffeLayer.name(), "Innerproduct");
    }
    
    // Sometimes caffe models do not populate the shape (infering from other parameters)
    if (caffeLayerWeights.blobs(0).shape().dim_size() == 0) {
        outputChannels = caffeLayerWeights.blobs(0).height();
        inputChannels = caffeLayerWeights.blobs(0).width();
    } else {
        outputChannels = caffeLayerWeights.blobs(0).shape().dim(0);
        inputChannels = caffeLayerWeights.blobs(0).shape().dim(1);
    }

    uint64_t numOutput = caffeLayerParams.num_output();
    bool hasBias = caffeLayerParams.bias_term();
    int64_t caffeBiasLength = 0;
    if (caffeLayerWeights.blobs_size()>1){
        caffeBiasLength = caffeLayerWeights.blobs(1).data_size();
    }
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerParams.transpose() == true) {
        CoreMLConverter::unsupportedCaffeParrameter("transpose",caffeLayer.name(), "Inner Product");
    }
    if (caffeLayerParams.axis() != 1) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("axis", caffeLayer.name(), "Inner Product",
                                  std::to_string(caffeLayerParams.axis()));
    }
    if ( (hasBias && caffeBiasLength==0) || (!hasBias && caffeBiasLength>0)){
        CoreMLConverter::errorInCaffeProto("'bias_term' flag and blob size for bias incompatible", caffeLayer.name(), "Inner Product");
    }
    assert(outputChannels >= 0);
    if (static_cast<uint64_t>(outputChannels) != numOutput) {
        CoreMLConverter::errorInCaffeProto("'num_output' ("+std::to_string(numOutput)+") does not match the first dimension of the weight matrix ("+std::to_string(outputChannels)+")"
                                          ,caffeLayer.name(), "Inner Product");
    }
    //**************************************************************
    
    assert(inputChannels >= 0);
    specLayerParams->set_inputchannels(static_cast<uint64_t>(inputChannels));

    assert(outputChannels >= 0);
    specLayerParams->set_outputchannels(static_cast<uint64_t>(outputChannels));
    specLayerParams->set_hasbias(hasBias);
    
    // Write weights
    int64_t blobSize = inputChannels*outputChannels;
    int caffeBlobSizeWeights = caffeLayerWeights.blobs(0).data_size();
    if (caffeBlobSizeWeights != blobSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(blobSize)+" but found blob of size = "+std::to_string(caffeBlobSizeWeights)+" in caffe"
                                          , caffeLayer.name(), "Inner Product");
    }
    ::google::protobuf::RepeatedField<float>* weightsWrite = specLayerParams->mutable_weights()->mutable_floatvalue();
    assert(blobSize <= INT_MAX);
    weightsWrite->Resize(static_cast<int32_t>(blobSize), 0.0);
    weightsWrite->CopyFrom(caffeLayerWeights.blobs(0).data());
    
    
    // Write bias 
    if (hasBias) {
        if (caffeBiasLength != outputChannels) {
            CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(outputChannels)+" but found blob of size = "+std::to_string(caffeBiasLength)+" in caffe"
                                              , caffeLayer.name(), "Inner Product");
        }
        ::google::protobuf::RepeatedField<float>* biasWrite = specLayerParams->mutable_bias()->mutable_floatvalue();
        assert(outputChannels <= INT_MAX);
        biasWrite->Resize(static_cast<int32_t>(outputChannels), 0.0);
        biasWrite->CopyFrom(caffeLayerWeights.blobs(1).data());
    }

}